

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O2

void discard_entry(quicly_sentmap_t *map,quicly_sentmap_iter_t *iter)

{
  size_t *psVar1;
  st_quicly_sent_block_t *psVar2;
  st_quicly_sent_block_t *psVar3;
  uint __line;
  char *__function;
  char *__assertion;
  undefined **ppuVar4;
  
  if (iter->p->acked == (quicly_sent_acked_cb)0x0) {
    __assertion = "iter->p->acked != NULL";
    __function = "void discard_entry(quicly_sentmap_t *, quicly_sentmap_iter_t *)";
    __line = 0x49;
    goto LAB_0012cc1a;
  }
  iter->p->acked = (quicly_sent_acked_cb)0x0;
  ppuVar4 = (undefined **)iter->ref;
  psVar2 = ((st_quicly_sent_block_t *)ppuVar4)->next;
  psVar1 = &psVar2->num_entries;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    psVar3 = psVar2->next;
    if (psVar3 == (st_quicly_sent_block_t *)0x0) {
      if (psVar2 != map->tail) {
        __assertion = "block == map->tail";
        __function = 
        "struct st_quicly_sent_block_t **free_block(quicly_sentmap_t *, struct st_quicly_sent_block_t **)"
        ;
        __line = 0x38;
        goto LAB_0012cc1a;
      }
      if ((quicly_sentmap_t *)ppuVar4 == map) {
        map->head = (st_quicly_sent_block_t *)0x0;
        map->tail = (st_quicly_sent_block_t *)0x0;
      }
      else {
        map->tail = (st_quicly_sent_block_t *)ppuVar4;
        ((st_quicly_sent_block_t *)ppuVar4)->next = (st_quicly_sent_block_t *)0x0;
      }
      ppuVar4 = &free_block_dummy_ref;
    }
    else {
      ((st_quicly_sent_block_t *)ppuVar4)->next = psVar3;
      if (psVar3->num_entries == 0) {
        __assertion = "(*ref)->num_entries != 0";
        __function = 
        "struct st_quicly_sent_block_t **free_block(quicly_sentmap_t *, struct st_quicly_sent_block_t **)"
        ;
        __line = 0x36;
LAB_0012cc1a:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                      ,__line,__function);
      }
    }
    free(psVar2);
    iter->ref = (st_quicly_sent_block_t **)ppuVar4;
    psVar2 = ((st_quicly_sent_block_t *)ppuVar4)->next;
    iter->p = (quicly_sent_t *)((long)&psVar2[-1].entries[0xf].data + 0x10);
    iter->count = psVar2->num_entries + 1;
  }
  return;
}

Assistant:

static void discard_entry(quicly_sentmap_t *map, quicly_sentmap_iter_t *iter)
{
    assert(iter->p->acked != NULL);
    iter->p->acked = NULL;

    struct st_quicly_sent_block_t *block = *iter->ref;
    if (--block->num_entries == 0) {
        iter->ref = free_block(map, iter->ref);
        block = *iter->ref;
        iter->p = block->entries - 1;
        iter->count = block->num_entries + 1;
    }
}